

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.h
# Opt level: O2

void __thiscall aiAnimMesh::~aiAnimMesh(aiAnimMesh *this)

{
  uint a;
  long lVar1;
  
  if (this->mVertices != (aiVector3D *)0x0) {
    operator_delete__(this->mVertices);
  }
  if (this->mNormals != (aiVector3D *)0x0) {
    operator_delete__(this->mNormals);
  }
  if (this->mTangents != (aiVector3D *)0x0) {
    operator_delete__(this->mTangents);
  }
  if (this->mBitangents != (aiVector3D *)0x0) {
    operator_delete__(this->mBitangents);
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    if (this->mTextureCoords[lVar1] != (aiVector3D *)0x0) {
      operator_delete__(this->mTextureCoords[lVar1]);
    }
  }
  for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
    if (this->mColors[lVar1] != (aiColor4D *)0x0) {
      operator_delete__(this->mColors[lVar1]);
    }
  }
  return;
}

Assistant:

~aiAnimMesh()
    {
        delete [] mVertices;
        delete [] mNormals;
        delete [] mTangents;
        delete [] mBitangents;
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; a++) {
            delete [] mTextureCoords[a];
        }
        for( unsigned int a = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; a++) {
            delete [] mColors[a];
        }
    }